

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O2

uint16_t __thiscall
SimpleParallelAnalyzer::GetWordAtLocation(SimpleParallelAnalyzer *this,uint64_t sample_number)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  
  uVar2 = (ulong)((long)(this->mData).
                        super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mData).
                       super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = 0;
  }
  uVar4 = 0;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    AnalyzerChannelData::AdvanceToAbsPosition
              ((ulonglong)
               (this->mData).
               super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar2]);
    iVar1 = AnalyzerChannelData::GetBitState();
    if (iVar1 == 1) {
      uVar4 = uVar4 | (this->mDataMasks).
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar2];
    }
    AnalyzerResults::AddMarker
              ((ulonglong)
               (this->mResults)._M_t.
               super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
               ._M_t.
               super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
               .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
               (MarkerType)sample_number,(Channel *)0x0);
  }
  return uVar4;
}

Assistant:

uint16_t SimpleParallelAnalyzer::GetWordAtLocation( uint64_t sample_number )
{
    uint16_t result = 0;

    int num_data_lines = mData.size();

    for( int i = 0; i < num_data_lines; i++ )
    {
        mData[ i ]->AdvanceToAbsPosition( sample_number );
        if( mData[ i ]->GetBitState() == BIT_HIGH )
        {
            result |= mDataMasks[ i ];
        }
        mResults->AddMarker( sample_number, AnalyzerResults::Dot, mDataChannels[ i ] );
    }

    return result;
}